

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::avx::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::TriangleMIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float *pfVar1;
  undefined4 uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined4 uVar7;
  Scene *pSVar8;
  Geometry *pGVar9;
  RTCFilterFunctionN p_Var10;
  ulong uVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  byte bVar45;
  int iVar46;
  ulong uVar47;
  long lVar48;
  ulong uVar49;
  ulong uVar50;
  uint uVar51;
  ulong uVar52;
  NodeRef *pNVar53;
  size_t sVar54;
  ulong uVar55;
  float fVar56;
  float fVar61;
  float fVar62;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  float fVar63;
  vint4 bi;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  vint4 ai;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  float fVar91;
  undefined1 auVar92 [16];
  uint uVar94;
  uint uVar95;
  undefined1 auVar93 [16];
  uint uVar96;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  NodeRef *local_a88;
  undefined8 local_a78;
  undefined8 uStack_a70;
  undefined8 local_a68;
  undefined8 uStack_a60;
  undefined1 local_a18 [16];
  long local_a08;
  long local_a00;
  ulong local_9f8;
  undefined1 (*local_9f0) [16];
  RTCFilterFunctionNArguments args;
  undefined1 local_8c8 [16];
  undefined1 local_8b8 [16];
  float local_8a8 [4];
  undefined1 local_898 [16];
  undefined8 local_888;
  undefined8 uStack_880;
  undefined8 local_878;
  undefined8 uStack_870;
  RTCHitN local_868 [16];
  undefined1 local_858 [16];
  undefined1 local_848 [16];
  undefined4 local_838;
  undefined4 uStack_834;
  undefined4 uStack_830;
  undefined4 uStack_82c;
  undefined1 local_828 [16];
  undefined1 local_818 [16];
  undefined1 local_808 [16];
  uint local_7f8;
  uint uStack_7f4;
  uint uStack_7f0;
  uint uStack_7ec;
  uint uStack_7e8;
  uint uStack_7e4;
  uint uStack_7e0;
  uint uStack_7dc;
  NodeRef stack [244];
  
  stack[0] = root;
  uVar2 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  auVar85._4_4_ = uVar2;
  auVar85._0_4_ = uVar2;
  auVar85._8_4_ = uVar2;
  auVar85._12_4_ = uVar2;
  uVar2 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  auVar87._4_4_ = uVar2;
  auVar87._0_4_ = uVar2;
  auVar87._8_4_ = uVar2;
  auVar87._12_4_ = uVar2;
  uVar2 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  auVar89._4_4_ = uVar2;
  auVar89._0_4_ = uVar2;
  auVar89._8_4_ = uVar2;
  auVar89._12_4_ = uVar2;
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar4 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar5 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_9f8 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar49 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar55 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar50 = local_9f8 ^ 0x10;
  iVar46 = (tray->tnear).field_0.i[k];
  auVar92._4_4_ = iVar46;
  auVar92._0_4_ = iVar46;
  auVar92._8_4_ = iVar46;
  auVar92._12_4_ = iVar46;
  iVar46 = (tray->tfar).field_0.i[k];
  auVar93._4_4_ = iVar46;
  auVar93._0_4_ = iVar46;
  auVar93._8_4_ = iVar46;
  auVar93._12_4_ = iVar46;
  local_9f0 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_a88 = stack + 1;
LAB_00edb114:
  do {
    pNVar53 = local_a88;
    if (pNVar53 == stack) {
LAB_00edb829:
      return pNVar53 != stack;
    }
    local_a88 = pNVar53 + -1;
    sVar54 = pNVar53[-1].ptr;
    while ((sVar54 & 8) == 0) {
      auVar58 = vsubps_avx(*(undefined1 (*) [16])(sVar54 + 0x20 + local_9f8),auVar85);
      auVar57._0_4_ = fVar3 * auVar58._0_4_;
      auVar57._4_4_ = fVar3 * auVar58._4_4_;
      auVar57._8_4_ = fVar3 * auVar58._8_4_;
      auVar57._12_4_ = fVar3 * auVar58._12_4_;
      auVar58 = vsubps_avx(*(undefined1 (*) [16])(sVar54 + 0x20 + uVar49),auVar87);
      auVar64._0_4_ = fVar4 * auVar58._0_4_;
      auVar64._4_4_ = fVar4 * auVar58._4_4_;
      auVar64._8_4_ = fVar4 * auVar58._8_4_;
      auVar64._12_4_ = fVar4 * auVar58._12_4_;
      auVar58 = vpmaxsd_avx(auVar57,auVar64);
      auVar57 = vsubps_avx(*(undefined1 (*) [16])(sVar54 + 0x20 + uVar55),auVar89);
      auVar65._0_4_ = fVar5 * auVar57._0_4_;
      auVar65._4_4_ = fVar5 * auVar57._4_4_;
      auVar65._8_4_ = fVar5 * auVar57._8_4_;
      auVar65._12_4_ = fVar5 * auVar57._12_4_;
      auVar57 = vpmaxsd_avx(auVar65,auVar92);
      auVar58 = vpmaxsd_avx(auVar58,auVar57);
      auVar57 = vsubps_avx(*(undefined1 (*) [16])(sVar54 + 0x20 + uVar50),auVar85);
      auVar66._0_4_ = fVar3 * auVar57._0_4_;
      auVar66._4_4_ = fVar3 * auVar57._4_4_;
      auVar66._8_4_ = fVar3 * auVar57._8_4_;
      auVar66._12_4_ = fVar3 * auVar57._12_4_;
      auVar57 = vsubps_avx(*(undefined1 (*) [16])(sVar54 + 0x20 + (uVar49 ^ 0x10)),auVar87);
      auVar76._0_4_ = fVar4 * auVar57._0_4_;
      auVar76._4_4_ = fVar4 * auVar57._4_4_;
      auVar76._8_4_ = fVar4 * auVar57._8_4_;
      auVar76._12_4_ = fVar4 * auVar57._12_4_;
      auVar57 = vpminsd_avx(auVar66,auVar76);
      auVar64 = vsubps_avx(*(undefined1 (*) [16])(sVar54 + 0x20 + (uVar55 ^ 0x10)),auVar89);
      auVar77._0_4_ = fVar5 * auVar64._0_4_;
      auVar77._4_4_ = fVar5 * auVar64._4_4_;
      auVar77._8_4_ = fVar5 * auVar64._8_4_;
      auVar77._12_4_ = fVar5 * auVar64._12_4_;
      auVar64 = vpminsd_avx(auVar77,auVar93);
      auVar57 = vpminsd_avx(auVar57,auVar64);
      auVar58 = vpcmpgtd_avx(auVar58,auVar57);
      iVar46 = vmovmskps_avx(auVar58);
      if (iVar46 == 0xf) goto LAB_00edb114;
      bVar45 = (byte)iVar46 ^ 0xf;
      uVar47 = sVar54 & 0xfffffffffffffff0;
      lVar48 = 0;
      if (bVar45 != 0) {
        for (; (bVar45 >> lVar48 & 1) == 0; lVar48 = lVar48 + 1) {
        }
      }
      sVar54 = *(size_t *)(uVar47 + lVar48 * 8);
      uVar51 = bVar45 - 1 & (uint)bVar45;
      uVar52 = (ulong)uVar51;
      if (uVar51 != 0) {
        do {
          local_a88->ptr = sVar54;
          local_a88 = local_a88 + 1;
          lVar48 = 0;
          if (uVar52 != 0) {
            for (; (uVar52 >> lVar48 & 1) == 0; lVar48 = lVar48 + 1) {
            }
          }
          sVar54 = *(size_t *)(uVar47 + lVar48 * 8);
          uVar52 = uVar52 - 1 & uVar52;
        } while (uVar52 != 0);
      }
    }
    local_a00 = (ulong)((uint)sVar54 & 0xf) - 8;
    uVar47 = sVar54 & 0xfffffffffffffff0;
    for (local_a08 = 0; local_a08 != local_a00; local_a08 = local_a08 + 1) {
      lVar48 = local_a08 * 0xb0;
      pfVar1 = (float *)(uVar47 + 0x80 + lVar48);
      fVar21 = *pfVar1;
      fVar22 = pfVar1[1];
      fVar23 = pfVar1[2];
      fVar24 = pfVar1[3];
      pfVar1 = (float *)(uVar47 + 0x40 + lVar48);
      fVar25 = *pfVar1;
      fVar26 = pfVar1[1];
      fVar27 = pfVar1[2];
      fVar28 = pfVar1[3];
      auVar58._0_4_ = fVar21 * fVar25;
      auVar58._4_4_ = fVar22 * fVar26;
      auVar58._8_4_ = fVar23 * fVar27;
      auVar58._12_4_ = fVar24 * fVar28;
      pfVar1 = (float *)(uVar47 + 0x70 + lVar48);
      fVar29 = *pfVar1;
      fVar30 = pfVar1[1];
      fVar31 = pfVar1[2];
      fVar32 = pfVar1[3];
      pfVar1 = (float *)(uVar47 + 0x50 + lVar48);
      fVar33 = *pfVar1;
      fVar34 = pfVar1[1];
      fVar35 = pfVar1[2];
      fVar36 = pfVar1[3];
      auVar67._0_4_ = fVar29 * fVar33;
      auVar67._4_4_ = fVar30 * fVar34;
      auVar67._8_4_ = fVar31 * fVar35;
      auVar67._12_4_ = fVar32 * fVar36;
      local_898 = vsubps_avx(auVar67,auVar58);
      pfVar1 = (float *)(uVar47 + 0x60 + lVar48);
      fVar37 = *pfVar1;
      fVar38 = pfVar1[1];
      fVar39 = pfVar1[2];
      fVar40 = pfVar1[3];
      auVar68._0_4_ = fVar37 * fVar33;
      auVar68._4_4_ = fVar38 * fVar34;
      auVar68._8_4_ = fVar39 * fVar35;
      auVar68._12_4_ = fVar40 * fVar36;
      pfVar1 = (float *)(uVar47 + 0x30 + lVar48);
      fVar41 = *pfVar1;
      fVar42 = pfVar1[1];
      fVar43 = pfVar1[2];
      fVar44 = pfVar1[3];
      auVar78._0_4_ = fVar21 * fVar41;
      auVar78._4_4_ = fVar22 * fVar42;
      auVar78._8_4_ = fVar23 * fVar43;
      auVar78._12_4_ = fVar24 * fVar44;
      auVar65 = vsubps_avx(auVar78,auVar68);
      auVar79._0_4_ = fVar29 * fVar41;
      auVar79._4_4_ = fVar30 * fVar42;
      auVar79._8_4_ = fVar31 * fVar43;
      auVar79._12_4_ = fVar32 * fVar44;
      auVar97._0_4_ = fVar37 * fVar25;
      auVar97._4_4_ = fVar38 * fVar26;
      auVar97._8_4_ = fVar39 * fVar27;
      auVar97._12_4_ = fVar40 * fVar28;
      auVar66 = vsubps_avx(auVar97,auVar79);
      uVar2 = *(undefined4 *)(ray + k * 4);
      auVar98._4_4_ = uVar2;
      auVar98._0_4_ = uVar2;
      auVar98._8_4_ = uVar2;
      auVar98._12_4_ = uVar2;
      auVar58 = vsubps_avx(*(undefined1 (*) [16])(uVar47 + lVar48),auVar98);
      uVar2 = *(undefined4 *)(ray + k * 4 + 0x10);
      auVar99._4_4_ = uVar2;
      auVar99._0_4_ = uVar2;
      auVar99._8_4_ = uVar2;
      auVar99._12_4_ = uVar2;
      auVar57 = vsubps_avx(*(undefined1 (*) [16])(uVar47 + 0x10 + lVar48),auVar99);
      uVar2 = *(undefined4 *)(ray + k * 4 + 0x20);
      auVar100._4_4_ = uVar2;
      auVar100._0_4_ = uVar2;
      auVar100._8_4_ = uVar2;
      auVar100._12_4_ = uVar2;
      auVar64 = vsubps_avx(*(undefined1 (*) [16])(uVar47 + 0x20 + lVar48),auVar100);
      fVar6 = *(float *)(ray + k * 4 + 0x50);
      fVar61 = *(float *)(ray + k * 4 + 0x60);
      fVar63 = auVar64._0_4_;
      auVar101._0_4_ = fVar6 * fVar63;
      fVar12 = auVar64._4_4_;
      auVar101._4_4_ = fVar6 * fVar12;
      fVar15 = auVar64._8_4_;
      auVar101._8_4_ = fVar6 * fVar15;
      fVar18 = auVar64._12_4_;
      auVar101._12_4_ = fVar6 * fVar18;
      fVar91 = auVar57._0_4_;
      auVar102._0_4_ = fVar61 * fVar91;
      fVar13 = auVar57._4_4_;
      auVar102._4_4_ = fVar61 * fVar13;
      fVar16 = auVar57._8_4_;
      auVar102._8_4_ = fVar61 * fVar16;
      fVar19 = auVar57._12_4_;
      auVar102._12_4_ = fVar61 * fVar19;
      auVar57 = vsubps_avx(auVar102,auVar101);
      fVar62 = *(float *)(ray + k * 4 + 0x40);
      fVar56 = auVar58._0_4_;
      auVar59._0_4_ = fVar61 * fVar56;
      fVar14 = auVar58._4_4_;
      auVar59._4_4_ = fVar61 * fVar14;
      fVar17 = auVar58._8_4_;
      auVar59._8_4_ = fVar61 * fVar17;
      fVar20 = auVar58._12_4_;
      auVar59._12_4_ = fVar61 * fVar20;
      auVar69._0_4_ = fVar62 * fVar63;
      auVar69._4_4_ = fVar62 * fVar12;
      auVar69._8_4_ = fVar62 * fVar15;
      auVar69._12_4_ = fVar62 * fVar18;
      auVar64 = vsubps_avx(auVar69,auVar59);
      auVar70._0_4_ = fVar62 * fVar91;
      auVar70._4_4_ = fVar62 * fVar13;
      auVar70._8_4_ = fVar62 * fVar16;
      auVar70._12_4_ = fVar62 * fVar19;
      auVar80._0_4_ = fVar6 * fVar56;
      auVar80._4_4_ = fVar6 * fVar14;
      auVar80._8_4_ = fVar6 * fVar17;
      auVar80._12_4_ = fVar6 * fVar20;
      auVar76 = vsubps_avx(auVar80,auVar70);
      auVar81._0_4_ = local_898._0_4_ * fVar62 + fVar6 * auVar65._0_4_ + fVar61 * auVar66._0_4_;
      auVar81._4_4_ = local_898._4_4_ * fVar62 + fVar6 * auVar65._4_4_ + fVar61 * auVar66._4_4_;
      auVar81._8_4_ = local_898._8_4_ * fVar62 + fVar6 * auVar65._8_4_ + fVar61 * auVar66._8_4_;
      auVar81._12_4_ = local_898._12_4_ * fVar62 + fVar6 * auVar65._12_4_ + fVar61 * auVar66._12_4_;
      auVar71._8_4_ = 0x80000000;
      auVar71._0_8_ = 0x8000000080000000;
      auVar71._12_4_ = 0x80000000;
      auVar58 = vandps_avx(auVar81,auVar71);
      uVar51 = auVar58._0_4_;
      auVar86._0_4_ =
           (float)(uVar51 ^ (uint)(fVar37 * auVar57._0_4_ +
                                  fVar21 * auVar76._0_4_ + fVar29 * auVar64._0_4_));
      uVar94 = auVar58._4_4_;
      auVar86._4_4_ =
           (float)(uVar94 ^ (uint)(fVar38 * auVar57._4_4_ +
                                  fVar22 * auVar76._4_4_ + fVar30 * auVar64._4_4_));
      uVar95 = auVar58._8_4_;
      auVar86._8_4_ =
           (float)(uVar95 ^ (uint)(fVar39 * auVar57._8_4_ +
                                  fVar23 * auVar76._8_4_ + fVar31 * auVar64._8_4_));
      uVar96 = auVar58._12_4_;
      auVar86._12_4_ =
           (float)(uVar96 ^ (uint)(fVar40 * auVar57._12_4_ +
                                  fVar24 * auVar76._12_4_ + fVar32 * auVar64._12_4_));
      auVar88._0_4_ =
           (float)(uVar51 ^ (uint)(fVar41 * auVar57._0_4_ +
                                  fVar33 * auVar76._0_4_ + auVar64._0_4_ * fVar25));
      auVar88._4_4_ =
           (float)(uVar94 ^ (uint)(fVar42 * auVar57._4_4_ +
                                  fVar34 * auVar76._4_4_ + auVar64._4_4_ * fVar26));
      auVar88._8_4_ =
           (float)(uVar95 ^ (uint)(fVar43 * auVar57._8_4_ +
                                  fVar35 * auVar76._8_4_ + auVar64._8_4_ * fVar27));
      auVar88._12_4_ =
           (float)(uVar96 ^ (uint)(fVar44 * auVar57._12_4_ +
                                  fVar36 * auVar76._12_4_ + auVar64._12_4_ * fVar28));
      auVar64 = ZEXT816(0) << 0x20;
      auVar58 = vcmpps_avx(auVar86,auVar64,5);
      auVar57 = vcmpps_avx(auVar88,auVar64,5);
      auVar58 = vandps_avx(auVar58,auVar57);
      auVar72._8_4_ = 0x7fffffff;
      auVar72._0_8_ = 0x7fffffff7fffffff;
      auVar72._12_4_ = 0x7fffffff;
      auVar57 = vandps_avx(auVar81,auVar72);
      auVar64 = vcmpps_avx(auVar64,auVar81,4);
      auVar58 = vandps_avx(auVar58,auVar64);
      auVar60._0_4_ = auVar86._0_4_ + auVar88._0_4_;
      auVar60._4_4_ = auVar86._4_4_ + auVar88._4_4_;
      auVar60._8_4_ = auVar86._8_4_ + auVar88._8_4_;
      auVar60._12_4_ = auVar86._12_4_ + auVar88._12_4_;
      auVar64 = vcmpps_avx(auVar60,auVar57,2);
      auVar76 = auVar64 & auVar58;
      if ((((auVar76 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar76 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar76 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar76[0xf] < '\0'
         ) {
        auVar58 = vandps_avx(auVar58,auVar64);
        auVar90._0_4_ =
             (float)(uVar51 ^ (uint)(local_898._0_4_ * fVar56 +
                                    fVar91 * auVar65._0_4_ + fVar63 * auVar66._0_4_));
        auVar90._4_4_ =
             (float)(uVar94 ^ (uint)(local_898._4_4_ * fVar14 +
                                    fVar13 * auVar65._4_4_ + fVar12 * auVar66._4_4_));
        auVar90._8_4_ =
             (float)(uVar95 ^ (uint)(local_898._8_4_ * fVar17 +
                                    fVar16 * auVar65._8_4_ + fVar15 * auVar66._8_4_));
        auVar90._12_4_ =
             (float)(uVar96 ^ (uint)(local_898._12_4_ * fVar20 +
                                    fVar19 * auVar65._12_4_ + fVar18 * auVar66._12_4_));
        fVar6 = *(float *)(ray + k * 4 + 0x30);
        fVar61 = auVar57._0_4_;
        auVar73._0_4_ = fVar61 * fVar6;
        fVar62 = auVar57._4_4_;
        auVar73._4_4_ = fVar62 * fVar6;
        fVar63 = auVar57._8_4_;
        auVar73._8_4_ = fVar63 * fVar6;
        fVar91 = auVar57._12_4_;
        auVar73._12_4_ = fVar91 * fVar6;
        auVar64 = vcmpps_avx(auVar73,auVar90,1);
        fVar6 = *(float *)(ray + k * 4 + 0x80);
        auVar82._0_4_ = fVar61 * fVar6;
        auVar82._4_4_ = fVar62 * fVar6;
        auVar82._8_4_ = fVar63 * fVar6;
        auVar82._12_4_ = fVar91 * fVar6;
        auVar76 = vcmpps_avx(auVar90,auVar82,2);
        auVar64 = vandps_avx(auVar64,auVar76);
        auVar58 = vandps_avx(auVar64,auVar58);
        uVar51 = vmovmskps_avx(auVar58);
        if (uVar51 != 0) {
          local_a78 = auVar65._0_8_;
          uStack_a70 = auVar65._8_8_;
          local_888 = local_a78;
          uStack_880 = uStack_a70;
          local_a68 = auVar66._0_8_;
          uStack_a60 = auVar66._8_8_;
          local_878 = local_a68;
          uStack_870 = uStack_a60;
          pSVar8 = context->scene;
          auVar58 = vrcpps_avx(auVar57);
          fVar56 = auVar58._0_4_;
          auVar74._0_4_ = fVar61 * fVar56;
          fVar61 = auVar58._4_4_;
          auVar74._4_4_ = fVar62 * fVar61;
          fVar62 = auVar58._8_4_;
          auVar74._8_4_ = fVar63 * fVar62;
          fVar63 = auVar58._12_4_;
          auVar74._12_4_ = fVar91 * fVar63;
          auVar83._8_4_ = 0x3f800000;
          auVar83._0_8_ = 0x3f8000003f800000;
          auVar83._12_4_ = 0x3f800000;
          auVar58 = vsubps_avx(auVar83,auVar74);
          fVar56 = fVar56 + fVar56 * auVar58._0_4_;
          fVar61 = fVar61 + fVar61 * auVar58._4_4_;
          fVar62 = fVar62 + fVar62 * auVar58._8_4_;
          fVar63 = fVar63 + fVar63 * auVar58._12_4_;
          local_8a8[0] = fVar56 * auVar90._0_4_;
          local_8a8[1] = fVar61 * auVar90._4_4_;
          local_8a8[2] = fVar62 * auVar90._8_4_;
          local_8a8[3] = fVar63 * auVar90._12_4_;
          local_8c8._0_4_ = fVar56 * auVar86._0_4_;
          local_8c8._4_4_ = fVar61 * auVar86._4_4_;
          local_8c8._8_4_ = fVar62 * auVar86._8_4_;
          local_8c8._12_4_ = fVar63 * auVar86._12_4_;
          local_8b8._0_4_ = fVar56 * auVar88._0_4_;
          local_8b8._4_4_ = fVar61 * auVar88._4_4_;
          local_8b8._8_4_ = fVar62 * auVar88._8_4_;
          local_8b8._12_4_ = fVar63 * auVar88._12_4_;
          uVar52 = (ulong)(uVar51 & 0xff);
          do {
            uVar11 = 0;
            if (uVar52 != 0) {
              for (; (uVar52 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
              }
            }
            uVar51 = *(uint *)(lVar48 + uVar47 + 0x90 + uVar11 * 4);
            pGVar9 = (pSVar8->geometries).items[uVar51].ptr;
            if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                local_838 = *(undefined4 *)(local_8c8 + uVar11 * 4);
                uVar2 = *(undefined4 *)(local_8b8 + uVar11 * 4);
                local_828._4_4_ = uVar2;
                local_828._0_4_ = uVar2;
                local_828._8_4_ = uVar2;
                local_828._12_4_ = uVar2;
                *(float *)(ray + k * 4 + 0x80) = local_8a8[uVar11];
                args.context = context->user;
                local_808 = vshufps_avx(ZEXT416(uVar51),ZEXT416(uVar51),0);
                uVar2 = *(undefined4 *)(lVar48 + uVar47 + 0xa0 + uVar11 * 4);
                local_818._4_4_ = uVar2;
                local_818._0_4_ = uVar2;
                local_818._8_4_ = uVar2;
                local_818._12_4_ = uVar2;
                uVar2 = *(undefined4 *)(local_898 + uVar11 * 4);
                uVar7 = *(undefined4 *)((long)&local_888 + uVar11 * 4);
                local_858._4_4_ = uVar7;
                local_858._0_4_ = uVar7;
                local_858._8_4_ = uVar7;
                local_858._12_4_ = uVar7;
                uVar7 = *(undefined4 *)((long)&local_878 + uVar11 * 4);
                local_848._4_4_ = uVar7;
                local_848._0_4_ = uVar7;
                local_848._8_4_ = uVar7;
                local_848._12_4_ = uVar7;
                local_868[0] = (RTCHitN)(char)uVar2;
                local_868[1] = (RTCHitN)(char)((uint)uVar2 >> 8);
                local_868[2] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                local_868[3] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                local_868[4] = (RTCHitN)(char)uVar2;
                local_868[5] = (RTCHitN)(char)((uint)uVar2 >> 8);
                local_868[6] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                local_868[7] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                local_868[8] = (RTCHitN)(char)uVar2;
                local_868[9] = (RTCHitN)(char)((uint)uVar2 >> 8);
                local_868[10] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                local_868[0xb] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                local_868[0xc] = (RTCHitN)(char)uVar2;
                local_868[0xd] = (RTCHitN)(char)((uint)uVar2 >> 8);
                local_868[0xe] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                local_868[0xf] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                uStack_834 = local_838;
                uStack_830 = local_838;
                uStack_82c = local_838;
                vcmpps_avx(ZEXT1632(local_808),ZEXT1632(local_808),0xf);
                uStack_7f4 = (args.context)->instID[0];
                local_7f8 = uStack_7f4;
                uStack_7f0 = uStack_7f4;
                uStack_7ec = uStack_7f4;
                uStack_7e8 = (args.context)->instPrimID[0];
                uStack_7e4 = uStack_7e8;
                uStack_7e0 = uStack_7e8;
                uStack_7dc = uStack_7e8;
                local_a18 = *local_9f0;
                args.valid = (int *)local_a18;
                args.geometryUserPtr = pGVar9->userPtr;
                args.hit = local_868;
                args.N = 4;
                args.ray = (RTCRayN *)ray;
                if (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  (*pGVar9->occlusionFilterN)(&args);
                }
                if (local_a18 == (undefined1  [16])0x0) {
                  auVar58 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                  auVar58 = auVar58 ^ _DAT_01f46b70;
                }
                else {
                  p_Var10 = context->args->filter;
                  if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar9->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    (*p_Var10)(&args);
                  }
                  auVar57 = vpcmpeqd_avx(local_a18,_DAT_01f45a50);
                  auVar58 = auVar57 ^ _DAT_01f46b70;
                  auVar84._8_4_ = 0xff800000;
                  auVar84._0_8_ = 0xff800000ff800000;
                  auVar84._12_4_ = 0xff800000;
                  auVar57 = vblendvps_avx(auVar84,*(undefined1 (*) [16])(args.ray + 0x80),auVar57);
                  *(undefined1 (*) [16])(args.ray + 0x80) = auVar57;
                }
                auVar75._8_8_ = 0x100000001;
                auVar75._0_8_ = 0x100000001;
                if ((auVar75 & auVar58) == (undefined1  [16])0x0) {
                  *(float *)(ray + k * 4 + 0x80) = fVar6;
                  goto LAB_00edb786;
                }
              }
              *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
              goto LAB_00edb829;
            }
LAB_00edb786:
            uVar52 = uVar52 ^ 1L << (uVar11 & 0x3f);
          } while (uVar52 != 0);
        }
      }
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }